

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O3

ElemMat * __thiscall
projects::dpg::ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
::Eval(ElemMat *__return_storage_ptr__,
      ReactionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *this,
      Entity *cell)

{
  double *pdVar1;
  pointer pcVar2;
  pointer pcVar3;
  double dVar4;
  long lVar5;
  Index IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *dst;
  uint uVar9;
  uint uVar10;
  int iVar11;
  QuadRule *pQVar12;
  QuadRule *pQVar13;
  undefined4 extraout_var;
  CoeffReturnType pdVar15;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar16;
  ostream *poVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  PrecomputedScalarReferenceFiniteElement<double> *this_00;
  PrecomputedScalarReferenceFiniteElement<double> *pPVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  long lVar25;
  long lVar26;
  size_type k;
  double __tmp;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  elem_mat_t *mat;
  VectorXd determinants;
  vector<double,_std::allocator<double>_> gammaeval;
  stringstream ss;
  scalar_product_op<double,_double> local_359;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [2];
  undefined1 local_320 [40];
  variable_if_dynamic<long,__1> local_2f8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_2c0;
  undefined1 local_2b8 [32];
  scalar_constant_op<double> local_298;
  PointerType local_290;
  variable_if_dynamic<long,__1> vStack_288;
  undefined8 local_280;
  XprTypeNested pMStack_278;
  variable_if_dynamic<long,__1> local_270;
  variable_if_dynamic<long,__1> vStack_268;
  Index local_260;
  variable_if_dynamic<long,__1> local_250;
  scalar_constant_op<double> local_240;
  double local_230;
  PrecomputedScalarReferenceFiniteElement<double> *local_228;
  double local_220;
  void *local_218;
  ulong local_210;
  vector<double,_std::allocator<double>_> local_208;
  undefined1 local_1f0 [16];
  scalar_constant_op<double> local_1e0;
  scalar_constant_op<double> local_1d0;
  PointerType local_1c8;
  variable_if_dynamic<long,__1> vStack_1c0;
  undefined8 local_1b8;
  XprTypeNested pMStack_1b0;
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> vStack_1a0;
  Index local_198;
  variable_if_dynamic<long,__1> local_188;
  scalar_constant_op<double> local_178;
  PointerType local_168;
  variable_if_dynamic<long,__1> vStack_160;
  double local_158;
  XprTypeNested pMStack_150;
  variable_if_dynamic<long,__1> local_148;
  variable_if_dynamic<long,__1> vStack_140;
  Index local_138;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_68;
  XprTypeNested pMStack_50;
  long local_48;
  long lStack_40;
  Index local_38;
  long *plVar14;
  
  local_2c0 = &__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  uVar9 = (*cell->_vptr_Entity[4])(cell);
  uVar10 = (*cell->_vptr_Entity[4])(cell);
  if ((this->fe_precomp_trial_)._M_elems[uVar9 & 0xff].fe_ ==
      (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e0,"No local shape function on trial space for entity type ",0x37)
    ;
    iVar11 = (*cell->_vptr_Entity[4])(cell);
    local_2b8[0] = (char)iVar11;
    lf::base::operator<<((ostream *)&local_1e0,(RefEl *)local_2b8);
    pcVar3 = local_2b8 + 0x10;
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,"pfe_trial.isInitialized()","");
    pcVar2 = local_320 + 0x10;
    local_320._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1ba,(string *)local_358);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_320._0_8_ != pcVar2) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_2b8._0_8_ != pcVar3) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
    local_320._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,"");
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
    lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1ba,(string *)local_358);
    goto LAB_00183cdb;
  }
  pPVar21 = (this->fe_precomp_test_)._M_elems + (uVar10 & 0xff);
  if ((this->fe_precomp_test_)._M_elems[uVar10 & 0xff].fe_ ==
      (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e0,"No local shape function on test space for entity type ",0x36);
    iVar11 = (*cell->_vptr_Entity[4])(cell);
    local_2b8[0] = (char)iVar11;
    lf::base::operator<<((ostream *)&local_1e0,(RefEl *)local_2b8);
    pcVar3 = local_2b8 + 0x10;
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,"pfe_test.isInitialized()","");
    pcVar2 = local_320 + 0x10;
    local_320._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1bd,(string *)local_358);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_320._0_8_ != pcVar2) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_2b8._0_8_ != pcVar3) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
    local_320._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
               ,"");
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
    lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1bd,(string *)local_358);
    goto LAB_00183cdb;
  }
  this_00 = (this->fe_precomp_trial_)._M_elems + (uVar9 & 0xff);
  pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
  pQVar13 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(pPVar21);
  Eigen::
  CwiseBinaryOp<Eigen::numext::equal_to<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::numext::equal_to<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)local_1f0,&pQVar12->points_,&pQVar13->points_,(equal_to<double> *)local_2b8);
  lVar23 = *(Index *)(local_1f0._8_8_ + 0x10);
  if (lVar23 < 1) {
LAB_001836e1:
    pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
    local_228 = pPVar21;
    pQVar13 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(pPVar21);
    Eigen::
    CwiseBinaryOp<Eigen::numext::equal_to<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::numext::equal_to<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_1f0,&pQVar12->weights_,&pQVar13->weights_,(equal_to<double> *)local_2b8
                   );
    if (0 < *(Index *)(local_1f0._8_8_ + 8)) {
      lVar23 = 0;
      do {
        dVar4 = *(double *)(*(long *)local_1f0._0_8_ + lVar23 * 8);
        pdVar1 = (double *)(*(long *)local_1f0._8_8_ + lVar23 * 8);
        if ((dVar4 != *pdVar1) || (NAN(dVar4) || NAN(*pdVar1))) goto LAB_00183b83;
        lVar23 = lVar23 + 1;
      } while (*(Index *)(local_1f0._8_8_ + 8) != lVar23);
    }
    pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
    pPVar21 = local_228;
    IVar6 = (pQVar12->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(local_228);
    if ((int)IVar6 ==
        (int)(pQVar12->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols) {
      iVar11 = (*cell->_vptr_Entity[3])(cell);
      plVar14 = (long *)CONCAT44(extraout_var,iVar11);
      if (plVar14 == (long *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e0,"Invalid geometry",0x10);
        pcVar3 = local_2b8 + 0x10;
        local_2b8._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"geo_ptr != nullptr","")
        ;
        pcVar2 = local_320 + 0x10;
        local_320._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_320,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1c6,(string *)local_358)
        ;
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
        }
        if ((pointer)local_320._0_8_ != pcVar2) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        if ((pointer)local_2b8._0_8_ != pcVar3) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        local_2b8._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
        local_320._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_320,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                   ,"");
        local_358._0_8_ = local_358 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
        lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1c6,(string *)local_358)
        ;
      }
      else {
        iVar11 = (**(code **)*plVar14)(plVar14);
        if (iVar11 == 2) {
          pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
          (**(code **)(*plVar14 + 0x30))(&local_218,plVar14,&pQVar12->points_);
          pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
          if (local_210 ==
              (uint)(pQVar12->points_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols) {
            pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_208,
                       (pQVar12->points_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols,&(this->gamma_).value_,(allocator_type *)local_1f0);
            uVar9 = (*(pPVar21->super_ScalarReferenceFiniteElement<double>).
                      _vptr_ScalarReferenceFiniteElement[4])(pPVar21);
            uVar10 = (*(this_00->super_ScalarReferenceFiniteElement<double>).
                       _vptr_ScalarReferenceFiniteElement[4])(this_00);
            dst = local_2c0;
            (local_2c0->m_storage).m_data = (double *)0x0;
            (local_2c0->m_storage).m_rows = 0;
            (local_2c0->m_storage).m_cols = 0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (local_2c0,(ulong)uVar9,(ulong)uVar10);
            local_2b8._0_8_ = (pointer)0x0;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)local_1f0,(dst->m_storage).m_rows,(dst->m_storage).m_cols,
                             (scalar_constant_op<double> *)local_2b8);
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)dst,
                       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_1f0,(assign_op<double,_double> *)local_2b8);
            auVar8 = _DAT_0034d050;
            auVar7 = _DAT_0034d040;
            lVar23 = (dst->m_storage).m_rows * (dst->m_storage).m_cols;
            if (0 < lVar23) {
              pdVar1 = ((DenseStorage<double,__1,__1,__1,_0> *)&(local_2c0->m_storage).m_data)->
                       m_data;
              uVar19 = lVar23 + 0x1fffffffffffffff;
              uVar20 = uVar19 & 0x1fffffffffffffff;
              auVar27._8_4_ = (int)uVar20;
              auVar27._0_8_ = uVar20;
              auVar27._12_4_ = (int)(uVar20 >> 0x20);
              lVar23 = 0;
              auVar27 = auVar27 ^ _DAT_0034d050;
              do {
                auVar28._8_4_ = (int)lVar23;
                auVar28._0_8_ = lVar23;
                auVar28._12_4_ = (int)((ulong)lVar23 >> 0x20);
                auVar28 = (auVar28 | auVar7) ^ auVar8;
                if ((bool)(~(auVar28._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar28._0_4_ ||
                            auVar27._4_4_ < auVar28._4_4_) & 1)) {
                  pdVar1[lVar23] = local_1e0.m_other;
                }
                if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
                    auVar28._12_4_ <= auVar27._12_4_) {
                  pdVar1[lVar23 + 1] = local_1e0.m_other;
                }
                lVar23 = lVar23 + 2;
              } while ((uVar20 - ((uint)uVar19 & 1)) + 2 != lVar23);
            }
            uVar19 = 0;
            while( true ) {
              pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
              if ((uint)(pQVar12->points_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols <= uVar19) break;
              pQVar12 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
              pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                        operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                   &pQVar12->weights_,uVar19);
              local_230 = *pdVar15;
              pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                        operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                   &local_218,uVar19);
              local_230 = local_230 * *pdVar15;
              pMVar16 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                        PrecompReferenceShapeFunctions(local_228);
              Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                        ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                         local_358,pMVar16,uVar19);
              local_220 = local_230;
              Eigen::
              CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
              ::CwiseNullaryOp(&local_68,local_358._8_8_,1,(scalar_constant_op<double> *)&local_220)
              ;
              Eigen::
              CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
              ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)local_320,&local_68,(Rhs *)local_358,&local_359);
              local_220 = local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar19];
              Eigen::
              CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
              ::CwiseNullaryOp(&local_68,local_2f8.m_value,1,
                               (scalar_constant_op<double> *)&local_220);
              Eigen::
              CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_2b8,(Lhs *)local_320,&local_68,&local_359);
              pMVar16 = lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                        PrecompReferenceShapeFunctions(this_00);
              Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                        ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                         &local_68,pMVar16,uVar19);
              local_138 = local_38;
              local_148.m_value = local_48;
              vStack_140.m_value = lStack_40;
              local_158 = local_68.m_functor.m_other;
              pMStack_150 = pMStack_50;
              local_168 = (PointerType)local_68.m_rows.m_value;
              vStack_160.m_value = local_68._8_8_;
              local_1e0.m_other = (double)local_2b8._16_8_;
              local_1d0.m_other = local_298.m_other;
              local_198 = local_260;
              local_1a8.m_value = local_270.m_value;
              vStack_1a0.m_value = vStack_268.m_value;
              local_1b8 = local_280;
              pMStack_1b0 = pMStack_278;
              local_1c8 = local_290;
              vStack_1c0.m_value = vStack_288.m_value;
              local_188.m_value = local_250.m_value;
              local_178.m_other = local_240.m_other;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>,0>,Eigen::internal::add_assign_op<double,double>>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_2c0,
                         (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>
                          *)local_1f0,(add_assign_op<double,_double> *)&local_220,(type)0x0);
              uVar19 = uVar19 + 1;
            }
            if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_208.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_208.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            free(local_218);
            return (ElemMat *)local_2c0;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e0,"Mismatch ",9);
          poVar17 = std::ostream::_M_insert<long>((long)&local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17," <-> ",5);
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
          pcVar3 = local_2b8 + 0x10;
          local_2b8._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"determinants.size() == pfe_trial.Qr().NumPoints()","");
          pcVar2 = local_320 + 0x10;
          local_320._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_320,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)local_2b8,(string *)local_320,0x1d0,(string *)local_358);
          if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
            operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
          }
          if ((pointer)local_320._0_8_ != pcVar2) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((pointer)local_2b8._0_8_ != pcVar3) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          local_2b8._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
          local_320._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_320,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,"");
          local_358._0_8_ = local_358 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
          lf::base::AssertionFailed
                    ((string *)local_2b8,(string *)local_320,0x1d0,(string *)local_358);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1e0,"Only 2D implementation available",0x20);
          pcVar3 = local_2b8 + 0x10;
          local_2b8._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"geo_ptr->DimLocal() == 2","");
          pcVar2 = local_320 + 0x10;
          local_320._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_320,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)local_2b8,(string *)local_320,0x1c7,(string *)local_358);
          if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
            operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
          }
          if ((pointer)local_320._0_8_ != pcVar2) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((pointer)local_2b8._0_8_ != pcVar3) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          local_2b8._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
          local_320._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_320,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
                     ,"");
          local_358._0_8_ = local_358 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
          lf::base::AssertionFailed
                    ((string *)local_2b8,(string *)local_320,0x1c7,(string *)local_358);
        }
      }
      goto LAB_00183cdb;
    }
  }
  else {
    lVar18 = *(long *)local_1f0._0_8_;
    lVar22 = *(long *)local_1f0._8_8_;
    lVar5 = *(Index *)(local_1f0._8_8_ + 8);
    bVar24 = false;
    lVar25 = 0;
    do {
      if (0 < lVar5) {
        lVar26 = 0;
        do {
          dVar4 = *(double *)(lVar18 + lVar26 * 8);
          pdVar1 = (double *)(lVar22 + lVar26 * 8);
          if ((dVar4 != *pdVar1) || (NAN(dVar4) || NAN(*pdVar1))) goto LAB_001836d7;
          lVar26 = lVar26 + 1;
        } while (lVar5 != lVar26);
      }
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + lVar5 * 8;
      lVar18 = lVar18 + *(Index *)(local_1f0._0_8_ + 8) * 8;
      bVar24 = lVar23 <= lVar25;
    } while (lVar25 != lVar23);
LAB_001836d7:
    if (bVar24) goto LAB_001836e1;
  }
LAB_00183b83:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e0,"Qr missmatch",0xc);
  pcVar3 = local_2b8 + 0x10;
  local_2b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,
             "pfe_trial.Qr().Points() == pfe_test.Qr().Points() && pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() && pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints()"
             ,"");
  pcVar2 = local_320 + 0x10;
  local_320._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1c2,(string *)local_358);
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_320._0_8_ != pcVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if ((pointer)local_2b8._0_8_ != pcVar3) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"false","");
  local_320._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../loc_comp_dpg.h"
             ,"");
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
  lf::base::AssertionFailed((string *)local_2b8,(string *)local_320,0x1c2,(string *)local_358);
LAB_00183cdb:
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string((string *)local_2b8);
  abort();
}

Assistant:

typename ReactionElementMatrixProvider<SCALAR, REACTION_COEFF>::ElemMat
ReactionElementMatrixProvider<SCALAR, REACTION_COEFF>::Eval(
    const lf::mesh::Entity& cell) {
  // Obtain precomputed information about values of local shape functions
  // and their gradients at quadrature points.
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_trial =
      fe_precomp_trial_[cell.RefEl().Id()];
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<SCALAR>& pfe_test =
      fe_precomp_test_[cell.RefEl().Id()];

  // check initialization:
  LF_ASSERT_MSG(pfe_trial.isInitialized(),
                "No local shape function on trial space for entity type "
                    << cell.RefEl());
  LF_ASSERT_MSG(
      pfe_test.isInitialized(),
      "No local shape function on test space for entity type " << cell.RefEl());
  // check the consistency of the quadratrue rules used.
  LF_ASSERT_MSG(pfe_trial.Qr().Points() == pfe_test.Qr().Points() &&
                    pfe_trial.Qr().Weights() == pfe_test.Qr().Weights() &&
                    pfe_trial.Qr().NumPoints() == pfe_test.Qr().NumPoints(),
                "Qr missmatch");

  // query the geometry of the cell.
  const lf::geometry::Geometry* geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry");
  LF_ASSERT_MSG(geo_ptr->DimLocal() == 2, "Only 2D implementation available");

  // const lf::uscalfe::dim_t world_dim = geo_ptr->DimGlobal();

  // retrive information for parametric fem computation:
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(pfe_trial.Qr().Points()));
  LF_ASSERT_MSG(determinants.size() == pfe_trial.Qr().NumPoints(),
                "Mismatch " << determinants.size() << " <-> "
                            << pfe_trial.Qr().NumPoints());

  // evaluate gamm in the quadrature points.
  auto gammaeval = gamma_(cell, pfe_trial.Qr().Points());

  // initialize element matrix.
  elem_mat_t mat(pfe_test.NumRefShapeFunctions(),
                 pfe_trial.NumRefShapeFunctions());
  mat.setZero();

  for (size_type k = 0; k < pfe_trial.Qr().NumPoints(); ++k) {
    // transformed quadratrue weight.
    const double w = pfe_trial.Qr().Weights()[k] * determinants[k];
    // update element matrix.
    mat += w * pfe_test.PrecompReferenceShapeFunctions().col(k) * gammaeval[k] *
           pfe_trial.PrecompReferenceShapeFunctions().col(k).transpose();
  }

  return mat;
}